

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartFileMixingBasic.cpp
# Opt level: O3

void anon_unknown.dwarf_1f7001::readWholeFiles(string *fn)

{
  float fVar1;
  size_t sVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  undefined8 *puVar10;
  undefined8 *puVar11;
  float *pfVar12;
  float *pfVar13;
  int *piVar14;
  ChannelList *this;
  ChannelList *pCVar15;
  _Base_ptr p_Var16;
  _Base_ptr p_Var17;
  undefined4 uVar18;
  uint uVar19;
  ulong uVar20;
  int iVar21;
  uint uVar22;
  long lVar23;
  _Base_ptr p_Var24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  int iVar29;
  int iVar30;
  DeepScanLineInputPart part_1;
  Array2D<unsigned_int> sampleCount;
  MultiPartInputFile file;
  vector<int,_std::allocator<int>_> shuffledPartNumber;
  Array2D<Imath_3_2::half_*> deepHData;
  Array2D<float_*> deepFData;
  Array2D<unsigned_int_*> deepUData;
  FrameBuffer frameBuffer;
  Array2D<Imath_3_2::half> hData;
  Array2D<float> fData;
  Array2D<unsigned_int> uData;
  InputPart part;
  int local_214;
  _Base_ptr local_200;
  undefined1 local_1f8 [24];
  _Base_ptr p_Stack_1e0;
  _Base_ptr local_1d8;
  MultiPartInputFile local_1c8 [16];
  void *local_1b8;
  iterator iStack_1b0;
  int *local_1a8;
  Array2D<Imath_3_2::half_*> local_198;
  Array2D<float_*> local_178;
  Array2D<unsigned_int_*> local_158;
  DeepFrameBuffer local_140;
  Array2D<Imath_3_2::half> local_d8;
  Array2D<float> local_b8;
  Array2D<unsigned_int> local_98;
  ulong local_78;
  ulong local_70;
  FrameBuffer local_68;
  
  local_98._sizeX = 0;
  local_98._sizeY = 0;
  local_98._data = (uint *)0x0;
  local_b8._data = (float *)0x0;
  local_b8._sizeX = 0;
  local_b8._sizeY = 0;
  local_d8._data = (half *)0x0;
  local_d8._sizeX = 0;
  local_d8._sizeY = 0;
  local_158._data = (uint **)0x0;
  local_158._sizeX = 0;
  local_158._sizeY = 0;
  local_178._data = (float **)0x0;
  local_178._sizeX = 0;
  local_178._sizeY = 0;
  local_198._data = (half **)0x0;
  local_198._sizeX = 0;
  local_198._sizeY = 0;
  local_1d8 = (_Base_ptr)0x0;
  local_1f8._16_8_ = (_Base_ptr)0x0;
  p_Stack_1e0 = (_Base_ptr)0x0;
  iVar5 = Imf_3_2::globalThreadCount();
  uVar20 = 1;
  Imf_3_2::MultiPartInputFile::MultiPartInputFile(local_1c8,(char *)fn,iVar5,true);
  lVar23 = 0;
  while( true ) {
    uVar18 = (undefined4)uVar20;
    iVar5 = Imf_3_2::MultiPartInputFile::parts();
    if (iVar5 <= lVar23) break;
    Imf_3_2::MultiPartInputFile::header((int)local_1c8);
    puVar10 = (undefined8 *)Imf_3_2::Header::displayWindow();
    puVar11 = (undefined8 *)Imf_3_2::Header::displayWindow();
    iVar5 = -(uint)((int)*puVar11 == (int)*puVar10);
    iVar29 = -(uint)((int)((ulong)*puVar11 >> 0x20) == (int)((ulong)*puVar10 >> 0x20));
    auVar25._4_4_ = iVar5;
    auVar25._0_4_ = iVar5;
    auVar25._8_4_ = iVar29;
    auVar25._12_4_ = iVar29;
    iVar5 = movmskpd(uVar18,auVar25);
    if ((iVar5 != 3) ||
       (iVar29 = -(uint)((int)puVar11[1] == (int)puVar10[1]),
       iVar30 = -(uint)((int)((ulong)puVar11[1] >> 0x20) == (int)((ulong)puVar10[1] >> 0x20)),
       auVar26._4_4_ = iVar29, auVar26._0_4_ = iVar29, auVar26._8_4_ = iVar30,
       auVar26._12_4_ = iVar30, iVar29 = movmskpd((int)puVar11,auVar26), iVar29 != 3)) {
      __assert_fail("header.displayWindow () == headers[i].displayWindow ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                    ,0x317,"void (anonymous namespace)::readWholeFiles(const std::string &)");
    }
    puVar10 = (undefined8 *)Imf_3_2::Header::dataWindow();
    puVar11 = (undefined8 *)Imf_3_2::Header::dataWindow();
    iVar29 = -(uint)((int)*puVar11 == (int)*puVar10);
    iVar30 = -(uint)((int)((ulong)*puVar11 >> 0x20) == (int)((ulong)*puVar10 >> 0x20));
    auVar27._4_4_ = iVar29;
    auVar27._0_4_ = iVar29;
    auVar27._8_4_ = iVar30;
    auVar27._12_4_ = iVar30;
    uVar19 = movmskpd(iVar5,auVar27);
    uVar20 = (ulong)uVar19;
    if ((uVar19 != 3) ||
       (iVar5 = -(uint)((int)puVar11[1] == (int)puVar10[1]),
       iVar29 = -(uint)((int)((ulong)puVar11[1] >> 0x20) == (int)((ulong)puVar10[1] >> 0x20)),
       auVar28._4_4_ = iVar5, auVar28._0_4_ = iVar5, auVar28._8_4_ = iVar29, auVar28._12_4_ = iVar29
       , iVar5 = movmskpd((int)puVar11,auVar28), iVar5 != 3)) {
      __assert_fail("header.dataWindow () == headers[i].dataWindow ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                    ,0x318,"void (anonymous namespace)::readWholeFiles(const std::string &)");
    }
    pfVar12 = (float *)Imf_3_2::Header::pixelAspectRatio();
    fVar1 = *pfVar12;
    pfVar12 = (float *)Imf_3_2::Header::pixelAspectRatio();
    if ((fVar1 != *pfVar12) || (NAN(fVar1) || NAN(*pfVar12))) {
      __assert_fail("header.pixelAspectRatio () == headers[i].pixelAspectRatio ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                    ,0x319,"void (anonymous namespace)::readWholeFiles(const std::string &)");
    }
    pfVar12 = (float *)Imf_3_2::Header::screenWindowCenter();
    pfVar13 = (float *)Imf_3_2::Header::screenWindowCenter();
    if ((((*pfVar12 != *pfVar13) || (NAN(*pfVar12) || NAN(*pfVar13))) || (pfVar12[1] != pfVar13[1]))
       || (NAN(pfVar12[1]) || NAN(pfVar13[1]))) {
      __assert_fail("header.screenWindowCenter () == headers[i].screenWindowCenter ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                    ,0x31b,"void (anonymous namespace)::readWholeFiles(const std::string &)");
    }
    pfVar12 = (float *)Imf_3_2::Header::screenWindowWidth();
    fVar1 = *pfVar12;
    pfVar12 = (float *)Imf_3_2::Header::screenWindowWidth();
    if ((fVar1 != *pfVar12) || (NAN(fVar1) || NAN(*pfVar12))) {
      __assert_fail("header.screenWindowWidth () == headers[i].screenWindowWidth ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                    ,0x31c,"void (anonymous namespace)::readWholeFiles(const std::string &)");
    }
    piVar14 = (int *)Imf_3_2::Header::lineOrder();
    iVar5 = *piVar14;
    piVar14 = (int *)Imf_3_2::Header::lineOrder();
    if (iVar5 != *piVar14) {
      __assert_fail("header.lineOrder () == headers[i].lineOrder ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                    ,0x31d,"void (anonymous namespace)::readWholeFiles(const std::string &)");
    }
    piVar14 = (int *)Imf_3_2::Header::compression();
    iVar5 = *piVar14;
    piVar14 = (int *)Imf_3_2::Header::compression();
    if (iVar5 != *piVar14) {
      __assert_fail("header.compression () == headers[i].compression ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                    ,0x31e,"void (anonymous namespace)::readWholeFiles(const std::string &)");
    }
    this = (ChannelList *)Imf_3_2::Header::channels();
    pCVar15 = (ChannelList *)Imf_3_2::Header::channels();
    cVar3 = Imf_3_2::ChannelList::operator==(this,pCVar15);
    if (cVar3 == '\0') {
      __assert_fail("header.channels () == headers[i].channels ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                    ,799,"void (anonymous namespace)::readWholeFiles(const std::string &)");
    }
    puVar10 = (undefined8 *)Imf_3_2::Header::name_abi_cxx11_();
    puVar11 = (undefined8 *)Imf_3_2::Header::name_abi_cxx11_();
    sVar2 = puVar10[1];
    if ((sVar2 != puVar11[1]) ||
       ((sVar2 != 0 && (iVar5 = bcmp((void *)*puVar10,(void *)*puVar11,sVar2), iVar5 != 0)))) {
      __assert_fail("header.name () == headers[i].name ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                    ,800,"void (anonymous namespace)::readWholeFiles(const std::string &)");
    }
    puVar10 = (undefined8 *)Imf_3_2::Header::type_abi_cxx11_();
    puVar11 = (undefined8 *)Imf_3_2::Header::type_abi_cxx11_();
    sVar2 = puVar10[1];
    if ((sVar2 != puVar11[1]) ||
       ((sVar2 != 0 && (iVar5 = bcmp((void *)*puVar10,(void *)*puVar11,sVar2), iVar5 != 0)))) {
      __assert_fail("header.type () == headers[i].type ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                    ,0x321,"void (anonymous namespace)::readWholeFiles(const std::string &)");
    }
    lVar23 = lVar23 + 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Reading whole files ",0x14);
  std::ostream::flush();
  local_1b8 = (void *)0x0;
  iStack_1b0._M_current = (int *)0x0;
  local_1a8 = (int *)0x0;
  uVar20 = (DAT_001f0aa0 - (anonymous_namespace)::headers >> 3) * 0x6db6db6db6db6db7;
  local_140._map._M_t._M_impl._0_4_ = 0;
  uVar19 = (uint)uVar20;
  if (0 < (int)uVar19) {
    do {
      if (iStack_1b0._M_current == local_1a8) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&local_1b8,iStack_1b0,(int *)&local_140);
      }
      else {
        *iStack_1b0._M_current = local_140._map._M_t._M_impl._0_4_;
        iStack_1b0._M_current = iStack_1b0._M_current + 1;
      }
      local_140._map._M_t._M_impl._0_4_ = local_140._map._M_t._M_impl._0_4_ + 1;
    } while ((int)local_140._map._M_t._M_impl._0_4_ < (int)uVar19);
    if (0 < (int)uVar19) {
      uVar20 = uVar20 & 0xffffffff;
      do {
        iVar5 = random_int(uVar19);
        iVar29 = random_int(uVar19);
        uVar18 = *(undefined4 *)((long)local_1b8 + (long)iVar5 * 4);
        *(undefined4 *)((long)local_1b8 + (long)iVar5 * 4) =
             *(undefined4 *)((long)local_1b8 + (long)iVar29 * 4);
        *(undefined4 *)((long)local_1b8 + (long)iVar29 * 4) = uVar18;
        uVar22 = (int)uVar20 - 1;
        uVar20 = (ulong)uVar22;
      } while (uVar22 != 0);
      if (0 < (int)uVar19) {
        local_78 = (ulong)(uVar19 & 0x7fffffff);
        local_200 = (_Base_ptr)0x0;
        uVar20 = 0;
        do {
          iVar5 = *(int *)((long)local_1b8 + uVar20 * 4);
          lVar23 = (long)iVar5;
          local_70 = uVar20;
          switch(*(undefined4 *)((anonymous_namespace)::partTypes + lVar23 * 4)) {
          case 0:
            local_140._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            local_140._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            local_140._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &local_140._map._M_t._M_impl.super__Rb_tree_header._M_header;
            local_140._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            local_140._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 local_140._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            setInputFrameBuffer((FrameBuffer *)&local_140,
                                *(int *)((anonymous_namespace)::pixelTypes + lVar23 * 4),&local_98,
                                &local_b8,&local_d8,0xc1,0x10b);
            Imf_3_2::InputPart::InputPart((InputPart *)&local_68,local_1c8,iVar5);
            Imf_3_2::InputPart::setFrameBuffer(&local_68);
            Imf_3_2::InputPart::readPixels((int)&local_68,0);
            iVar5 = *(int *)((anonymous_namespace)::pixelTypes + lVar23 * 4);
            if (iVar5 == 0) {
              bVar4 = checkPixels<unsigned_int>(&local_98,0,0xc0,0,0x10a,0xc1);
              if (!bVar4) {
                __assert_fail("checkPixels<unsigned int> ( uData, width, height)",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                              ,0x352,
                              "void (anonymous namespace)::readWholeFiles(const std::string &)");
              }
            }
            else if (iVar5 == 1) {
              bVar4 = checkPixels<float>(&local_b8,0,0xc0,0,0x10a,0xc1);
              if (!bVar4) {
                __assert_fail("checkPixels<float> (fData, width, height)",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                              ,0x355,
                              "void (anonymous namespace)::readWholeFiles(const std::string &)");
              }
            }
            else if ((iVar5 == 2) &&
                    (bVar4 = checkPixels<Imath_3_2::half>(&local_d8,0,0xc0,0,0x10a,0xc1), !bVar4)) {
              __assert_fail("checkPixels<half> (hData, width, height)",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                            ,0x358,"void (anonymous namespace)::readWholeFiles(const std::string &)"
                           );
            }
            std::
            _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
            ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                         *)&local_140);
            break;
          case 1:
            Imf_3_2::TiledInputPart::TiledInputPart((TiledInputPart *)&local_68,local_1c8,iVar5);
            iVar5 = Imf_3_2::TiledInputPart::numXLevels();
            iVar29 = Imf_3_2::TiledInputPart::numYLevels();
            if (0 < iVar5) {
              iVar30 = 0;
              do {
                if (0 < iVar29) {
                  iVar6 = 0;
                  do {
                    cVar3 = Imf_3_2::TiledInputPart::isValidLevel((int)&local_68,iVar30);
                    if (cVar3 != '\0') {
                      iVar8 = Imf_3_2::TiledInputPart::levelWidth((int)&local_68);
                      iVar21 = Imf_3_2::TiledInputPart::levelHeight((int)&local_68);
                      local_140._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
                      local_140._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                           (_Base_ptr)0x0;
                      local_140._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                           &local_140._map._M_t._M_impl.super__Rb_tree_header._M_header;
                      local_140._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
                      local_140._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                           local_140._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                      setInputFrameBuffer((FrameBuffer *)&local_140,
                                          *(int *)((anonymous_namespace)::pixelTypes + lVar23 * 4),
                                          &local_98,&local_b8,&local_d8,iVar8,iVar21);
                      Imf_3_2::TiledInputPart::setFrameBuffer(&local_68);
                      iVar9 = (int)&local_68;
                      iVar7 = Imf_3_2::TiledInputPart::numXTiles(iVar9);
                      iVar9 = Imf_3_2::TiledInputPart::numYTiles(iVar9);
                      Imf_3_2::TiledInputPart::readTiles
                                ((int)&local_68,0,iVar7 + -1,0,iVar9 + -1,iVar30);
                      iVar7 = *(int *)((anonymous_namespace)::pixelTypes + lVar23 * 4);
                      if (iVar7 == 0) {
                        bVar4 = checkPixels<unsigned_int>
                                          (&local_98,0,iVar8 + -1,0,iVar21 + -1,iVar8);
                        if (!bVar4) {
                          __assert_fail("checkPixels<unsigned int> ( uData, w, h)",
                                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                                        ,0x381,
                                        "void (anonymous namespace)::readWholeFiles(const std::string &)"
                                       );
                        }
                      }
                      else if (iVar7 == 1) {
                        bVar4 = checkPixels<float>(&local_b8,0,iVar8 + -1,0,iVar21 + -1,iVar8);
                        if (!bVar4) {
                          __assert_fail("checkPixels<float> (fData, w, h)",
                                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                                        ,900,
                                        "void (anonymous namespace)::readWholeFiles(const std::string &)"
                                       );
                        }
                      }
                      else if ((iVar7 == 2) &&
                              (bVar4 = checkPixels<Imath_3_2::half>
                                                 (&local_d8,0,iVar8 + -1,0,iVar21 + -1,iVar8),
                              !bVar4)) {
                        __assert_fail("checkPixels<half> (hData, w, h)",
                                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                                      ,0x387,
                                      "void (anonymous namespace)::readWholeFiles(const std::string &)"
                                     );
                      }
                      std::
                      _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                      ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                                   *)&local_140);
                    }
                    iVar6 = iVar6 + 1;
                  } while (iVar29 != iVar6);
                }
                iVar30 = iVar30 + 1;
              } while (iVar30 != iVar5);
            }
            break;
          case 2:
            Imf_3_2::DeepScanLineInputPart::DeepScanLineInputPart
                      ((DeepScanLineInputPart *)local_1f8,local_1c8,iVar5);
            local_140._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            local_140._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            local_140._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &local_140._map._M_t._M_impl.super__Rb_tree_header._M_header;
            local_140._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            local_140._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 local_140._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            Imf_3_2::Slice::Slice(&local_140._sampleCounts,HALF,(char *)0x0,0,0,1,1,0.0,false,false)
            ;
            p_Var16 = (_Base_ptr)operator_new__(0x3252c);
            if (local_200 != (_Base_ptr)0x0) {
              operator_delete__(local_200);
            }
            local_1f8._16_8_ = (_Base_ptr)0x10b;
            p_Stack_1e0 = (_Base_ptr)0xc1;
            local_1d8 = p_Var16;
            Imf_3_2::Slice::Slice
                      ((Slice *)&local_68,UINT,(char *)p_Var16,4,0x304,1,1,0.0,false,false);
            Imf_3_2::DeepFrameBuffer::insertSampleCountSlice((Slice *)&local_140);
            setInputDeepFrameBuffer
                      (&local_140,*(int *)((anonymous_namespace)::pixelTypes + lVar23 * 4),
                       &local_158,&local_178,&local_198,0xc1,0x10b);
            Imf_3_2::DeepScanLineInputPart::setFrameBuffer((DeepFrameBuffer *)local_1f8);
            iVar5 = (int)(DeepFrameBuffer *)local_1f8;
            Imf_3_2::DeepScanLineInputPart::readPixelSampleCounts(iVar5,0);
            allocatePixels(*(int *)((anonymous_namespace)::pixelTypes + lVar23 * 4),
                           (Array2D<unsigned_int> *)(local_1f8 + 0x10),&local_158,&local_178,
                           &local_198,0,0xc0,0,0x10a);
            Imf_3_2::DeepScanLineInputPart::readPixels(iVar5,0);
            iVar5 = *(int *)((anonymous_namespace)::pixelTypes + lVar23 * 4);
            if (iVar5 == 0) {
              bVar4 = checkPixels<unsigned_int>
                                ((Array2D<unsigned_int> *)(local_1f8 + 0x10),&local_158,0,0xc0,0,
                                 0x10a,0xc1);
              if (!bVar4) {
                __assert_fail("checkPixels<unsigned int> ( sampleCount, deepUData, width, height)",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                              ,0x3b4,
                              "void (anonymous namespace)::readWholeFiles(const std::string &)");
              }
            }
            else if (iVar5 == 1) {
              bVar4 = checkPixels<float>((Array2D<unsigned_int> *)(local_1f8 + 0x10),&local_178,0,
                                         0xc0,0,0x10a,0xc1);
              if (!bVar4) {
                __assert_fail("checkPixels<float> ( sampleCount, deepFData, width, height)",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                              ,0x3b8,
                              "void (anonymous namespace)::readWholeFiles(const std::string &)");
              }
            }
            else if ((iVar5 == 2) &&
                    (bVar4 = checkPixels<Imath_3_2::half>
                                       ((Array2D<unsigned_int> *)(local_1f8 + 0x10),&local_198,0,
                                        0xc0,0,0x10a,0xc1), !bVar4)) {
              __assert_fail("checkPixels<half> ( sampleCount, deepHData, width, height)",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                            ,0x3bc,"void (anonymous namespace)::readWholeFiles(const std::string &)"
                           );
            }
            releasePixels(*(int *)((anonymous_namespace)::pixelTypes + lVar23 * 4),&local_158,
                          &local_178,&local_198,0,0xc0,0,0x10a);
            std::
            _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
            ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
                         *)&local_140);
            local_200 = p_Var16;
            break;
          case 3:
            Imf_3_2::DeepTiledInputPart::DeepTiledInputPart
                      ((DeepTiledInputPart *)local_1f8,local_1c8,iVar5);
            local_1f8._12_4_ = Imf_3_2::DeepTiledInputPart::numXLevels();
            iVar5 = Imf_3_2::DeepTiledInputPart::numYLevels();
            if (0 < (int)local_1f8._12_4_) {
              local_214 = 0;
              do {
                if (0 < iVar5) {
                  iVar29 = 0;
                  p_Var16 = local_200;
                  do {
                    iVar30 = (int)local_1f8;
                    cVar3 = Imf_3_2::DeepTiledInputPart::isValidLevel(iVar30,local_214);
                    p_Var17 = p_Var16;
                    if (cVar3 != '\0') {
                      iVar6 = Imf_3_2::DeepTiledInputPart::levelWidth(iVar30);
                      iVar30 = Imf_3_2::DeepTiledInputPart::levelHeight(iVar30);
                      local_140._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
                      local_140._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                           (_Base_ptr)0x0;
                      local_140._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                           &local_140._map._M_t._M_impl.super__Rb_tree_header._M_header;
                      local_140._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
                      local_140._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                           local_140._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                      Imf_3_2::Slice::Slice
                                (&local_140._sampleCounts,HALF,(char *)0x0,0,0,1,1,0.0,false,false);
                      p_Var24 = (_Base_ptr)(long)iVar6;
                      uVar20 = (long)iVar30 * (long)p_Var24;
                      p_Var17 = (_Base_ptr)
                                operator_new__(-(ulong)(uVar20 >> 0x3e != 0) | uVar20 * 4);
                      if (p_Var16 != (_Base_ptr)0x0) {
                        operator_delete__(p_Var16);
                      }
                      local_1f8._16_8_ = (_Base_ptr)(long)iVar30;
                      p_Stack_1e0 = p_Var24;
                      local_1d8 = p_Var17;
                      Imf_3_2::Slice::Slice
                                ((Slice *)&local_68,UINT,(char *)p_Var17,4,(long)p_Var24 << 2,1,1,
                                 0.0,false,false);
                      Imf_3_2::DeepFrameBuffer::insertSampleCountSlice((Slice *)&local_140);
                      setInputDeepFrameBuffer
                                (&local_140,*(int *)((anonymous_namespace)::pixelTypes + lVar23 * 4)
                                 ,&local_158,&local_178,&local_198,iVar6,iVar30);
                      Imf_3_2::DeepTiledInputPart::setFrameBuffer((DeepFrameBuffer *)local_1f8);
                      iVar7 = Imf_3_2::DeepTiledInputPart::numXTiles((int)local_1f8);
                      iVar8 = Imf_3_2::DeepTiledInputPart::numYTiles((int)local_1f8);
                      Imf_3_2::DeepTiledInputPart::readPixelSampleCounts
                                ((int)local_1f8,0,iVar7 + -1,0,iVar8 + -1,local_214);
                      iVar21 = iVar6 + -1;
                      iVar30 = iVar30 + -1;
                      allocatePixels(*(int *)((anonymous_namespace)::pixelTypes + lVar23 * 4),
                                     (Array2D<unsigned_int> *)(local_1f8 + 0x10),&local_158,
                                     &local_178,&local_198,0,iVar21,0,iVar30);
                      Imf_3_2::DeepTiledInputPart::readTiles
                                ((int)local_1f8,0,iVar7 + -1,0,iVar8 + -1,local_214);
                      iVar7 = *(int *)((anonymous_namespace)::pixelTypes + lVar23 * 4);
                      if (iVar7 == 0) {
                        bVar4 = checkPixels<unsigned_int>
                                          ((Array2D<unsigned_int> *)(local_1f8 + 0x10),&local_158,0,
                                           iVar21,0,iVar30,iVar6);
                        if (!bVar4) {
                          __assert_fail("checkPixels<unsigned int> ( sampleCount, deepUData, w, h)",
                                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                                        ,0x409,
                                        "void (anonymous namespace)::readWholeFiles(const std::string &)"
                                       );
                        }
                      }
                      else if (iVar7 == 1) {
                        bVar4 = checkPixels<float>((Array2D<unsigned_int> *)(local_1f8 + 0x10),
                                                   &local_178,0,iVar21,0,iVar30,iVar6);
                        if (!bVar4) {
                          __assert_fail("checkPixels<float> ( sampleCount, deepFData, w, h)",
                                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                                        ,0x40d,
                                        "void (anonymous namespace)::readWholeFiles(const std::string &)"
                                       );
                        }
                      }
                      else if ((iVar7 == 2) &&
                              (bVar4 = checkPixels<Imath_3_2::half>
                                                 ((Array2D<unsigned_int> *)(local_1f8 + 0x10),
                                                  &local_198,0,iVar21,0,iVar30,iVar6), !bVar4)) {
                        __assert_fail("checkPixels<half> ( sampleCount, deepHData, w, h)",
                                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                                      ,0x411,
                                      "void (anonymous namespace)::readWholeFiles(const std::string &)"
                                     );
                      }
                      releasePixels(*(int *)((anonymous_namespace)::pixelTypes + lVar23 * 4),
                                    &local_158,&local_178,&local_198,0,iVar21,0,iVar30);
                      std::
                      _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
                      ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
                                   *)&local_140);
                      local_200 = p_Var17;
                    }
                    iVar29 = iVar29 + 1;
                    p_Var16 = p_Var17;
                  } while (iVar5 != iVar29);
                }
                local_214 = local_214 + 1;
              } while (local_214 != local_1f8._12_4_);
            }
          }
          uVar20 = local_70 + 1;
        } while (uVar20 != local_78);
        goto LAB_0017ff88;
      }
    }
  }
  local_200 = (_Base_ptr)0x0;
LAB_0017ff88:
  if (local_1b8 != (void *)0x0) {
    operator_delete(local_1b8,(long)local_1a8 - (long)local_1b8);
  }
  Imf_3_2::MultiPartInputFile::~MultiPartInputFile(local_1c8);
  if (local_200 != (_Base_ptr)0x0) {
    operator_delete__(local_200);
  }
  if (local_198._data != (half **)0x0) {
    operator_delete__(local_198._data);
  }
  if (local_178._data != (float **)0x0) {
    operator_delete__(local_178._data);
  }
  if (local_158._data != (uint **)0x0) {
    operator_delete__(local_158._data);
  }
  if (local_d8._data != (half *)0x0) {
    operator_delete__(local_d8._data);
  }
  if (local_b8._data != (float *)0x0) {
    operator_delete__(local_b8._data);
  }
  if (local_98._data != (uint *)0x0) {
    operator_delete__(local_98._data);
  }
  return;
}

Assistant:

void
readWholeFiles (const std::string& fn)
{
    Array2D<unsigned int> uData;
    Array2D<float>        fData;
    Array2D<half>         hData;

    Array2D<unsigned int*> deepUData;
    Array2D<float*>        deepFData;
    Array2D<half*>         deepHData;

    Array2D<unsigned int> sampleCount;

    MultiPartInputFile file (fn.c_str ());
    for (int i = 0; i < file.parts (); i++)
    {
        const Header& header = file.header (i);
        assert (header.displayWindow () == headers[i].displayWindow ());
        assert (header.dataWindow () == headers[i].dataWindow ());
        assert (header.pixelAspectRatio () == headers[i].pixelAspectRatio ());
        assert (
            header.screenWindowCenter () == headers[i].screenWindowCenter ());
        assert (header.screenWindowWidth () == headers[i].screenWindowWidth ());
        assert (header.lineOrder () == headers[i].lineOrder ());
        assert (header.compression () == headers[i].compression ());
        assert (header.channels () == headers[i].channels ());
        assert (header.name () == headers[i].name ());
        assert (header.type () == headers[i].type ());
    }

    cout << "Reading whole files " << flush;

    //
    // Shuffle part numbers.
    //
    vector<int> shuffledPartNumber;
    int         nHeaders = static_cast<int> (headers.size ());
    for (int i = 0; i < nHeaders; i++)
        shuffledPartNumber.push_back (i);
    for (int i = 0; i < nHeaders; i++)
    {
        int a = random_int (nHeaders);
        int b = random_int (nHeaders);
        swap (shuffledPartNumber[a], shuffledPartNumber[b]);
    }

    //
    // Start reading whole files.
    //
    int i;
    int partNumber;
    try
    {
        for (i = 0; i < nHeaders; i++)
        {
            partNumber = shuffledPartNumber[i];
            switch (partTypes[partNumber])
            {
                case 0: {
                    FrameBuffer frameBuffer;
                    setInputFrameBuffer (
                        frameBuffer,
                        pixelTypes[partNumber],
                        uData,
                        fData,
                        hData,
                        width,
                        height);

                    InputPart part (file, partNumber);
                    part.setFrameBuffer (frameBuffer);
                    part.readPixels (0, height - 1);
                    switch (pixelTypes[partNumber])
                    {
                        case 0:
                            assert (checkPixels<unsigned int> (
                                uData, width, height));
                            break;
                        case 1:
                            assert (checkPixels<float> (fData, width, height));
                            break;
                        case 2:
                            assert (checkPixels<half> (hData, width, height));
                            break;
                    }
                    break;
                }
                case 1: {
                    TiledInputPart part (file, partNumber);
                    int            numXLevels = part.numXLevels ();
                    int            numYLevels = part.numYLevels ();
                    for (int xLevel = 0; xLevel < numXLevels; xLevel++)
                        for (int yLevel = 0; yLevel < numYLevels; yLevel++)
                        {
                            if (!part.isValidLevel (xLevel, yLevel)) continue;

                            int w = part.levelWidth (xLevel);
                            int h = part.levelHeight (yLevel);

                            FrameBuffer frameBuffer;
                            setInputFrameBuffer (
                                frameBuffer,
                                pixelTypes[partNumber],
                                uData,
                                fData,
                                hData,
                                w,
                                h);

                            part.setFrameBuffer (frameBuffer);
                            int numXTiles = part.numXTiles (xLevel);
                            int numYTiles = part.numYTiles (yLevel);
                            part.readTiles (
                                0,
                                numXTiles - 1,
                                0,
                                numYTiles - 1,
                                xLevel,
                                yLevel);
                            switch (pixelTypes[partNumber])
                            {
                                case 0:
                                    assert (checkPixels<unsigned int> (
                                        uData, w, h));
                                    break;
                                case 1:
                                    assert (checkPixels<float> (fData, w, h));
                                    break;
                                case 2:
                                    assert (checkPixels<half> (hData, w, h));
                                    break;
                            }
                        }
                    break;
                }
                case 2: {
                    DeepScanLineInputPart part (file, partNumber);

                    DeepFrameBuffer frameBuffer;

                    sampleCount.resizeErase (height, width);
                    frameBuffer.insertSampleCountSlice (Slice (
                        IMF::UINT,
                        (char*) (&sampleCount[0][0]),
                        sizeof (unsigned int) * 1,
                        sizeof (unsigned int) * width));

                    setInputDeepFrameBuffer (
                        frameBuffer,
                        pixelTypes[partNumber],
                        deepUData,
                        deepFData,
                        deepHData,
                        width,
                        height);

                    part.setFrameBuffer (frameBuffer);

                    part.readPixelSampleCounts (0, height - 1);

                    allocatePixels (
                        pixelTypes[partNumber],
                        sampleCount,
                        deepUData,
                        deepFData,
                        deepHData,
                        width,
                        height);

                    part.readPixels (0, height - 1);
                    switch (pixelTypes[partNumber])
                    {
                        case 0:
                            assert (checkPixels<unsigned int> (
                                sampleCount, deepUData, width, height));
                            break;
                        case 1:
                            assert (checkPixels<float> (
                                sampleCount, deepFData, width, height));
                            break;
                        case 2:
                            assert (checkPixels<half> (
                                sampleCount, deepHData, width, height));
                            break;
                    }

                    releasePixels (
                        pixelTypes[partNumber],
                        deepUData,
                        deepFData,
                        deepHData,
                        width,
                        height);

                    break;
                }
                case 3: {
                    DeepTiledInputPart part (file, partNumber);
                    int                numXLevels = part.numXLevels ();
                    int                numYLevels = part.numYLevels ();
                    for (int xLevel = 0; xLevel < numXLevels; xLevel++)
                        for (int yLevel = 0; yLevel < numYLevels; yLevel++)
                        {
                            if (!part.isValidLevel (xLevel, yLevel)) continue;

                            int w = part.levelWidth (xLevel);
                            int h = part.levelHeight (yLevel);

                            DeepFrameBuffer frameBuffer;

                            sampleCount.resizeErase (h, w);
                            frameBuffer.insertSampleCountSlice (Slice (
                                IMF::UINT,
                                (char*) (&sampleCount[0][0]),
                                sizeof (unsigned int) * 1,
                                sizeof (unsigned int) * w));

                            setInputDeepFrameBuffer (
                                frameBuffer,
                                pixelTypes[partNumber],
                                deepUData,
                                deepFData,
                                deepHData,
                                w,
                                h);

                            part.setFrameBuffer (frameBuffer);

                            int numXTiles = part.numXTiles (xLevel);
                            int numYTiles = part.numYTiles (yLevel);

                            part.readPixelSampleCounts (
                                0,
                                numXTiles - 1,
                                0,
                                numYTiles - 1,
                                xLevel,
                                yLevel);

                            allocatePixels (
                                pixelTypes[partNumber],
                                sampleCount,
                                deepUData,
                                deepFData,
                                deepHData,
                                w,
                                h);

                            part.readTiles (
                                0,
                                numXTiles - 1,
                                0,
                                numYTiles - 1,
                                xLevel,
                                yLevel);
                            switch (pixelTypes[partNumber])
                            {
                                case 0:
                                    assert (checkPixels<unsigned int> (
                                        sampleCount, deepUData, w, h));
                                    break;
                                case 1:
                                    assert (checkPixels<float> (
                                        sampleCount, deepFData, w, h));
                                    break;
                                case 2:
                                    assert (checkPixels<half> (
                                        sampleCount, deepHData, w, h));
                                    break;
                            }

                            releasePixels (
                                pixelTypes[partNumber],
                                deepUData,
                                deepFData,
                                deepHData,
                                w,
                                h);
                        }

                    break;
                }
            }
        }
    }
    catch (...)
    {
        cout << "Error while reading part " << partNumber << endl << flush;
        throw;
    }
}